

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O3

void luaK_setreturns(FuncState *fs,expdesc *e,int nresults)

{
  Instruction *pIVar1;
  
  if (e->k == VVARARG) {
    pIVar1 = fs->f->code;
    pIVar1[(e->u).info] =
         (nresults << 0x17 | pIVar1[(e->u).info] & 0x7fc03f) + (uint)fs->freereg * 0x40 + 0x800000;
    luaK_checkstack(fs,1);
    fs->freereg = fs->freereg + '\x01';
  }
  else if (e->k == VCALL) {
    pIVar1 = fs->f->code;
    pIVar1[(e->u).info] = nresults * 0x4000 + 0x4000U & 0x7fc000 | pIVar1[(e->u).info] & 0xff803fff;
  }
  return;
}

Assistant:

void luaK_setreturns(FuncState *fs, expdesc *e, int nresults) {
    if (e->k == VCALL) {  /* expression is an open function call? */
        SETARG_C(getinstruction(fs, e), nresults + 1);
    } else if (e->k == VVARARG) {
        Instruction *pc = &getinstruction(fs, e);
        SETARG_B(*pc, nresults + 1);
        SETARG_A(*pc, fs->freereg);
        luaK_reserveregs(fs, 1);
    } else
        lua_assert(nresults == LUA_MULTRET);
}